

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

size_t semver::detail::length<int>(int n)

{
  size_t sVar1;
  uint uVar2;
  
  sVar1 = 0;
  do {
    sVar1 = sVar1 + 1;
    uVar2 = n + 9;
    n = n / 10;
  } while (0x12 < uVar2);
  return sVar1;
}

Assistant:

SEMVER_CONSTEXPR std::size_t length(Int n) noexcept {
      std::size_t digits = 0;
      do {
        digits++;
        n /= 10;
      } while (n != 0);
      return digits;
    }